

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd-wizard.c
# Opt level: O1

void do_cmd_wiz_summon_named(command *cmd)

{
  uint32_t *puVar1;
  loc grid;
  bool bVar2;
  _Bool _Var3;
  _Bool _Var4;
  wchar_t wVar5;
  monster_race *race;
  int iVar6;
  wchar_t r_idx;
  char s [80];
  int local_8c;
  loc local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  
  wVar5 = cmd_get_arg_number((command_conflict *)cmd,"index",&local_8c);
  if (wVar5 == L'\0') {
    if (((long)local_8c < 1) || ((int)(uint)z_info->r_max <= local_8c)) {
      race = (monster_race *)0x0;
    }
    else {
      race = r_info + local_8c;
    }
  }
  else {
    local_48 = 0;
    uStack_40 = 0;
    local_58 = 0;
    uStack_50 = 0;
    local_68 = 0;
    uStack_60 = 0;
    local_78 = 0;
    uStack_70 = 0;
    local_88.x = L'\0';
    local_88.y = L'\0';
    uStack_80 = 0;
    _Var3 = get_string("Summon which monster? ",(char *)&local_88,0x50);
    if (_Var3) {
      _Var4 = get_int_from_string((char *)&local_88,&local_8c);
      if (_Var4) {
        if (((long)local_8c < 1) || ((int)(uint)z_info->r_max <= local_8c)) {
          race = (monster_race *)0x0;
        }
        else {
          race = r_info + local_8c;
        }
      }
      else {
        race = lookup_monster((char *)&local_88);
      }
      if (race != (monster_race *)0x0) {
        cmd_set_arg_number((command_conflict *)cmd,"index",race->ridx);
      }
    }
    else {
      race = (monster_race *)0x0;
    }
    if (!_Var3) {
      return;
    }
  }
  if (race == (monster_race *)0x0) {
    msg("No monster found.");
  }
  else {
    iVar6 = 0;
    do {
      if ((iVar6 < 10) &&
         (grid.x = (player->grid).x, grid.y = (player->grid).y,
         wVar5 = scatter_ext(cave,&local_88,L'\x01',grid,L'\x01',true,square_isempty),
         wVar5 != L'\0')) {
        _Var3 = place_new_monster((chunk *)cave,(loc_conflict)local_88,race,true,true,
                                  (monster_group_info)0x0,'\x19');
        if (_Var3) {
          puVar1 = &player->upkeep->redraw;
          *puVar1 = *puVar1 | 0x410000;
          bVar2 = false;
        }
        else {
          iVar6 = iVar6 + 1;
          bVar2 = true;
        }
      }
      else {
        bVar2 = false;
        msg("Could not place monster.");
      }
    } while (bVar2);
  }
  return;
}

Assistant:

void do_cmd_wiz_summon_named(struct command *cmd)
{
	int r_idx, i = 0;
	struct monster_race *r = NULL;
	struct monster_group_info info = { 0, 0 };

	if (cmd_get_arg_number(cmd, "index", &r_idx) == CMD_OK) {
		if (r_idx > 0 && r_idx < z_info->r_max) {
			r = &r_info[r_idx];
		}
	} else {
		char s[80] = "";

		if (!get_string("Summon which monster? ", s, sizeof(s))) return;
		/* See if an index was entered */
		if (get_int_from_string(s, &r_idx)) {
			if (r_idx > 0 && r_idx < z_info->r_max) {
				r = &r_info[r_idx];
			}
		} else {
			/* If not, find by name */
			r = lookup_monster(s);
		}
		if (r != NULL) {
			cmd_set_arg_number(cmd, "index", r->ridx);
		}
	}

	if (r == NULL) {
		msg("No monster found.");
		return;
	}

	/* Try 10 times */
	while (1) {
		struct loc grid;

		/* Pick an empty location. */
		if (i >= 10 || scatter_ext(cave, &grid, 1, player->grid, 1,
				true, square_isempty) == 0) {
			msg("Could not place monster.");
			break;
		}

		/* Try to place. */
		if (place_new_monster(cave, grid, r, true, true,
				info, ORIGIN_DROP_WIZARD)) {
			player->upkeep->redraw |= PR_MAP | PR_MONLIST;
			break;
		}

		++i;
	}
}